

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O2

RepRef __thiscall
absl::cord_internal::anon_unknown_16::CordRepAnalyzer::CountLinearReps
          (CordRepAnalyzer *this,RepRef rep,MemoryUsage *memory_usage)

{
  size_t *psVar1;
  long *plVar2;
  CordzStatistics *pCVar3;
  size_t sVar4;
  CordRepKind CVar5;
  CordRepSubstring *pCVar6;
  CordRepFlat *this_00;
  CordRep *this_01;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  RepRef RVar12;
  long lStack_50;
  RepRef local_48;
  size_t local_38;
  undefined8 uStack_30;
  
  sVar7 = rep.refcount;
  this_01 = rep.rep;
  while (local_48.rep = this_01, local_48.refcount = sVar7, CVar5 = RepRef::tag(&local_48),
        CVar5 == SUBSTRING) {
    pCVar3 = this->statistics_;
    psVar1 = &pCVar3->node_count;
    *psVar1 = *psVar1 + 1;
    psVar1 = &(pCVar3->node_counts).substring;
    *psVar1 = *psVar1 + 1;
    memory_usage->total = memory_usage->total + 0x20;
    auVar9._8_4_ = (int)(sVar7 >> 0x20);
    auVar9._0_8_ = sVar7;
    auVar9._12_4_ = 0x45300000;
    memory_usage->fair_share =
         32.0 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0)) +
         memory_usage->fair_share;
    pCVar6 = CordRep::substring(this_01);
    this_01 = pCVar6->child;
    if (this_01 == (CordRep *)0x0) {
      sVar7 = 0;
    }
    else {
      sVar7 = sVar7 * (long)((this_01->refcount).count_.super___atomic_base<int>._M_i >> 1);
    }
  }
  uStack_30 = 0;
  local_38 = sVar7;
  CVar5 = RepRef::tag(&local_48);
  if (CVar5 < FLAT) {
    CVar5 = RepRef::tag(&local_48);
    if (CVar5 != EXTERNAL) goto LAB_00130102;
    pCVar3 = this->statistics_;
    psVar1 = &pCVar3->node_count;
    *psVar1 = *psVar1 + 1;
    psVar1 = &(pCVar3->node_counts).external;
    *psVar1 = *psVar1 + 1;
    sVar7 = this_01->length + 0x28;
  }
  else {
    this_00 = CordRep::flat(this_01);
    sVar7 = CordRepFlat::AllocatedSize(this_00);
    pCVar3 = this->statistics_;
    sVar4 = (pCVar3->node_counts).flat;
    auVar10._8_4_ = 0xffffffff;
    auVar10._0_8_ = 0xffffffffffffffff;
    auVar10._12_4_ = 0xffffffff;
    pCVar3->node_count = pCVar3->node_count + 1;
    (pCVar3->node_counts).flat = sVar4 - auVar10._8_8_;
    if (sVar7 < 0x41) {
      lStack_50 = 0x28;
    }
    else if (sVar7 < 0x81) {
      lStack_50 = 0x30;
    }
    else if (sVar7 < 0x101) {
      lStack_50 = 0x38;
    }
    else if (sVar7 < 0x201) {
      lStack_50 = 0x40;
    }
    else {
      if (0x400 < sVar7) goto LAB_001300a8;
      lStack_50 = 0x48;
    }
    plVar2 = (long *)((long)&pCVar3->size + lStack_50);
    *plVar2 = *plVar2 + 1;
  }
LAB_001300a8:
  memory_usage->total = memory_usage->total + sVar7;
  auVar8._8_4_ = (int)(sVar7 >> 0x20);
  auVar8._0_8_ = sVar7;
  auVar8._12_4_ = 0x45300000;
  auVar11._8_4_ = (int)(local_38 >> 0x20);
  auVar11._0_8_ = local_38;
  auVar11._12_4_ = 0x45300000;
  memory_usage->fair_share =
       ((auVar8._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0)) /
       ((auVar11._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)local_38) - 4503599627370496.0)) + memory_usage->fair_share
  ;
  this_01 = (CordRep *)0x0;
  sVar7 = 0;
LAB_00130102:
  RVar12.refcount = sVar7;
  RVar12.rep = this_01;
  return RVar12;
}

Assistant:

RepRef CountLinearReps(RepRef rep, MemoryUsage& memory_usage) {
    // Consume all substrings
    while (rep.tag() == SUBSTRING) {
      statistics_.node_count++;
      statistics_.node_counts.substring++;
      memory_usage.Add(sizeof(CordRepSubstring), rep.refcount);
      rep = rep.Child(rep.rep->substring()->child);
    }

    // Consume possible FLAT
    if (rep.tag() >= FLAT) {
      size_t size = rep.rep->flat()->AllocatedSize();
      CountFlat(size);
      memory_usage.Add(size, rep.refcount);
      return RepRef{nullptr, 0};
    }

    // Consume possible external
    if (rep.tag() == EXTERNAL) {
      statistics_.node_count++;
      statistics_.node_counts.external++;
      size_t size = rep.rep->length + sizeof(CordRepExternalImpl<intptr_t>);
      memory_usage.Add(size, rep.refcount);
      return RepRef{nullptr, 0};
    }

    return rep;
  }